

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O3

adios2_error adios2_remove_attribute(adios2_bool *result,adios2_io *io,char *name)

{
  byte bVar1;
  allocator local_61;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"for adios2_io, in call to adios2_remove_attribute","");
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)local_60,name,&local_61);
  bVar1 = adios2::core::IO::RemoveAttribute((string *)io);
  *result = (uint)bVar1;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_remove_attribute(adios2_bool *result, adios2_io *io, const char *name)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_remove_attribute");
        *result = reinterpret_cast<adios2::core::IO *>(io)->RemoveAttribute(name) ? adios2_true
                                                                                  : adios2_false;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_remove_attribute"));
    }
}